

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitBitVector.h
# Opt level: O1

bool __thiscall BVUnitT<unsigned_long>::Dump(BVUnitT<unsigned_long> *this,BVIndex base,bool hasBits)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  
  uVar4 = this->word;
  if (uVar4 != 0) {
    uVar2 = 0;
    bVar3 = hasBits;
    if (uVar4 != 0) {
      for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    do {
      AssertRange((BVIndex)uVar2);
      if ((bVar3 & 1) != 0) {
        Output::Print(L", ");
      }
      uVar4 = uVar4 & ~(1L << (uVar2 & 0x3f));
      Output::Print(L"%u",(ulong)((BVIndex)uVar2 + base));
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar2 = (ulong)(-(uint)(uVar4 == 0) | (uint)lVar1);
      hasBits = true;
      bVar3 = 1;
    } while (uVar4 != 0);
  }
  return hasBits;
}

Assistant:

bool Dump(BVIndex base = 0, bool hasBits = false) const
    {
        FOREACH_BITSET_IN_UNITBV(index, *this, BVUnitT)
        {
            if (hasBits)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%u"), index + base);
            hasBits = true;
        }
        NEXT_BITSET_IN_UNITBV;
        return hasBits;
    }